

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

void p_hash_table_insert(PHashTable *table,ppointer key,ppointer value)

{
  puint hash_00;
  PHashTableNode *pPVar1;
  puint hash;
  PHashTableNode *node;
  ppointer value_local;
  ppointer key_local;
  PHashTable *table_local;
  
  if (table != (PHashTable *)0x0) {
    hash_00 = pp_hash_table_calc_hash(key,table->size);
    pPVar1 = pp_hash_table_find_node(table,key,hash_00);
    if (pPVar1 == (PHashTableNode *)0x0) {
      pPVar1 = (PHashTableNode *)p_malloc0(0x18);
      if (pPVar1 == (PHashTableNode *)0x0) {
        printf("** Error: %s **\n","PHashTable::p_hash_table_insert: failed to allocate memory");
      }
      else {
        pPVar1->key = key;
        pPVar1->value = value;
        pPVar1->next = table->table[hash_00];
        table->table[hash_00] = pPVar1;
      }
    }
    else {
      pPVar1->value = value;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_insert (PHashTable *table, ppointer key, ppointer value)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return;

	hash = pp_hash_table_calc_hash (key, table->size);

	if ((node = pp_hash_table_find_node (table, key, hash)) == NULL) {
		if (P_UNLIKELY ((node = p_malloc0 (sizeof (PHashTableNode))) == NULL)) {
			P_ERROR ("PHashTable::p_hash_table_insert: failed to allocate memory");
			return;
		}

		/* Insert a new node in front of others */
		node->key   = key;
		node->value = value;
		node->next  = table->table[hash];

		table->table[hash] = node;
	} else
		node->value = value;
}